

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ninx::parser::element::ForStatement,_std::default_delete<ninx::parser::element::ForStatement>_>
 __thiscall ninx::parser::Parser::parse_for_statement(Parser *this)

{
  TokenReader *this_00;
  int iVar1;
  Token *pTVar2;
  Variable *this_01;
  string *psVar3;
  undefined8 extraout_RAX;
  Parser *in_RSI;
  undefined1 local_60 [8];
  string iterator_name;
  _Alloc_hider local_38;
  
  this_00 = &in_RSI->reader;
  iVar1 = TokenReader::check_type(this_00,FOR);
  if (iVar1 == 1) {
    TokenReader::get_token(this_00);
    iVar1 = TokenReader::check_type(this_00,VARIABLE);
    if (iVar1 == 1) {
      pTVar2 = TokenReader::get_token(this_00);
      this_01 = (Variable *)
                __dynamic_cast(pTVar2,&lexer::token::Token::typeinfo,
                               &lexer::token::Variable::typeinfo,0);
      psVar3 = lexer::token::Variable::get_name_abi_cxx11_(this_01);
      std::__cxx11::string::string((string *)&iterator_name,(string *)psVar3);
      iVar1 = TokenReader::check_limiter(this_00,':');
      if (iVar1 == 1) {
        TokenReader::get_token(this_00);
        parse_level_3_expression((Parser *)&stack0xffffffffffffffc8);
        parse_block((Parser *)local_60);
        std::
        make_unique<ninx::parser::element::ForStatement,std::__cxx11::string&,std::unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>>
                  (&this->origin,
                   (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                    *)&iterator_name,
                   (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                    *)&stack0xffffffffffffffc8);
        if (local_60 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_60 + 8))();
        }
        if ((long *)local_38._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_38._M_p + 8))();
        }
        std::__cxx11::string::~string((string *)&iterator_name);
        return (__uniq_ptr_data<ninx::parser::element::ForStatement,_std::default_delete<ninx::parser::element::ForStatement>,_true,_true>
                )(__uniq_ptr_data<ninx::parser::element::ForStatement,_std::default_delete<ninx::parser::element::ForStatement>,_true,_true>
                  )this;
      }
      goto LAB_001206c8;
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&iterator_name,"Expected for statement",
               (allocator *)&stack0xffffffffffffffc8);
    generate_exception(in_RSI,&iterator_name);
  }
  std::__cxx11::string::string
            ((string *)&iterator_name,"Expected iterator name ( as variable, for example $i )",
             (allocator *)&stack0xffffffffffffffc8);
  generate_exception(in_RSI,&iterator_name);
LAB_001206c8:
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffc8,"Expected :",(allocator *)local_60);
  generate_exception(in_RSI,(string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string((string *)&iterator_name);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::unique_ptr<ForStatement> ninx::parser::Parser::parse_for_statement() {
    if (reader.check_type(Type::FOR) != 1) {
        generate_exception("Expected for statement");
    }
    reader.get_token();

    // Read the iterator name
    if (reader.check_type(Type::VARIABLE) != 1) {
        generate_exception("Expected iterator name ( as variable, for example $i )");
    }
    auto iterator_name_token {reader.get_token()};
    std::string iterator_name {dynamic_cast<ninx::lexer::token::Variable*>(iterator_name_token)->get_name()};

    // Expect : separator
    if (reader.check_limiter(':') != 1) {
        generate_exception("Expected :");
    }
    reader.get_token();

    // Parse the expression
    auto expression {parse_expression()};

    // Parse the for body
    auto body {parse_block()};

    auto for_condition = std::make_unique<ForStatement>(iterator_name, std::move(expression), std::move(body));

    return for_condition;
}